

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  _func_int **pp_Var1;
  pointer *ppuVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  pointer pTVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  initializer_list<TestFundElementsUtxoVector> __l;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext context;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  UtxoFilter filter;
  ElementsUtxoAndOption txin_utxo;
  ElementsAddressFactory factory;
  ConfidentialAssetId fee_asset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ExtPubkey key;
  ElementsConfidentialAddress ct_addr1;
  ConfidentialTransactionController ctx;
  Address addr3;
  Address addr2;
  Address addr1;
  ElementsConfidentialAddress reserve_ct_addr1;
  Address addr;
  ConfidentialTransactionContext tx;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  undefined4 in_stack_ffffffffffffe8cc;
  undefined4 in_stack_ffffffffffffe8f4;
  Txid local_16f8;
  undefined1 local_16d8 [47];
  vector local_16a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16a8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1688;
  undefined1 local_1670 [184];
  AssertHelper local_15b8 [2];
  undefined1 local_15a8 [16];
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1598;
  undefined1 local_1578 [32];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1558;
  long local_1540;
  vector local_1534 [4];
  undefined1 *local_1530 [2];
  undefined1 local_1520 [16];
  long local_1510;
  long local_1508;
  undefined1 local_14f8 [16];
  _func_int *local_14e8 [2];
  uint32_t local_14d8;
  undefined1 local_14d0 [40];
  _Alloc_hider local_14a8;
  void *local_14a0;
  char local_1498 [16];
  undefined1 *local_1488 [2];
  undefined1 local_1478 [16];
  undefined4 local_1468;
  undefined1 *local_1460;
  undefined1 *local_1438 [2];
  undefined1 local_1428 [16];
  undefined1 *local_1418 [2];
  undefined1 local_1408 [16];
  undefined4 local_13f8;
  undefined1 *local_13f0;
  undefined1 *local_13c8 [2];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8 [2];
  undefined1 local_1398 [16];
  undefined4 local_1388;
  undefined1 *local_1380;
  undefined1 *local_1358 [2];
  undefined1 local_1348 [16];
  undefined1 *local_1338 [2];
  undefined1 local_1328 [16];
  undefined4 local_1318;
  undefined1 *local_1310;
  undefined1 *local_12e8 [2];
  undefined1 local_12d8 [16];
  char **local_12c8;
  undefined1 local_12c0 [8];
  char *local_12b8 [2];
  undefined4 local_12a8;
  _func_int **local_12a0;
  undefined1 local_1298;
  undefined4 local_1290;
  undefined1 local_1280 [8];
  uchar *local_1278;
  uchar local_1268 [16];
  undefined1 *local_1258 [2];
  undefined1 local_1248 [16];
  undefined4 local_1238;
  undefined1 *local_1230;
  undefined1 *local_1208 [2];
  undefined1 local_11f8 [16];
  undefined1 *local_11e8 [2];
  undefined1 local_11d8 [16];
  undefined4 local_11c8;
  undefined1 *local_11c0;
  undefined1 *local_1198 [2];
  undefined1 local_1188 [16];
  undefined1 *local_1178 [2];
  undefined1 local_1168 [16];
  undefined4 local_1158;
  undefined1 *local_1150;
  undefined1 *local_1128 [2];
  undefined1 local_1118 [16];
  undefined1 *local_1108 [2];
  undefined1 local_10f8 [16];
  undefined4 local_10e8;
  undefined1 *local_10e0;
  undefined1 *local_10b8 [2];
  undefined1 local_10a8 [16];
  undefined1 *local_1098 [2];
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined1 *local_1070;
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  undefined1 *local_1028 [2];
  undefined1 local_1018 [16];
  uint local_1008;
  uint32_t local_1004;
  undefined1 local_1000 [40];
  uint32_t *local_fd8;
  uint32_t local_fc8 [4];
  undefined **local_fb8 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_fa8 [24]
  ;
  ConfidentialAssetId local_f90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_f68;
  ConfidentialAssetId local_f38;
  undefined **local_f00;
  void *local_ef8;
  void *local_ed0 [4];
  Pubkey local_eb0;
  Amount local_e98 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e88;
  ExtPubkey local_e58;
  SigHashType local_de4 [12];
  undefined1 local_dd8 [432];
  undefined **local_c28 [2];
  ConfidentialTransaction local_c18 [64];
  string local_bd8 [16];
  undefined1 *local_bc8;
  undefined1 local_bb8 [16];
  void *local_ba8;
  void *local_b90;
  void *local_b78;
  code *local_b60 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_ae8;
  Script local_ad0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a90;
  string local_a60 [16];
  undefined1 *local_a50;
  undefined1 local_a40 [16];
  void *local_a30;
  void *local_a18;
  void *local_a00;
  code *local_9e8 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_970;
  Script local_958;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_918;
  string local_8e8 [16];
  undefined1 *local_8d8;
  undefined1 local_8c8 [16];
  void *local_8b8;
  void *local_8a0;
  void *local_888;
  code *local_870 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_7f8;
  Script local_7e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7a0;
  Pubkey local_770 [18];
  string local_5c0 [16];
  undefined1 *local_5b0;
  undefined1 local_5a0 [16];
  void *local_590;
  void *local_578;
  void *local_560;
  code *local_548 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_4d0;
  Script local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  ConfidentialTransactionContext local_448 [184];
  Pubkey local_390 [18];
  Pubkey local_1e0 [18];
  
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar5 != 0) {
      local_14f8._0_8_ = local_14e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14f8,
                 "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a","");
      local_14d8 = 0;
      local_14d0._0_8_ = &DAT_12a05f20;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_14a8._M_p = local_1498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_14a8,
                 "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))","");
      local_1488[0] = local_1478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1488,
                 "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a","");
      local_1468 = 0;
      local_1460 = &DAT_04a817c8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1438[0] = local_1428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1438,
                 "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))","");
      local_1418[0] = local_1408;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1418,
                 "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a","");
      local_13f8 = 0;
      local_13f0 = &DAT_4a817c80;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_13c8[0] = local_13b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13c8,
                 "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))","");
      local_13a8[0] = local_1398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13a8,
                 "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a","");
      local_1388 = 0;
      local_1380 = &DAT_02540be4;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1358[0] = local_1348;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1358,
                 "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))","");
      local_1338[0] = local_1328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1338,
                 "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a","");
      local_1318 = 0;
      local_1310 = &DAT_09502f90;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_12e8[0] = local_12d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12e8,
                 "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))","");
      local_12c8 = local_12b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_12c8,
                 "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b","");
      local_12a8 = 0;
      local_12a0 = (_func_int **)0x9502f900;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1278 = local_1268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1278,
                 "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))","");
      local_1258[0] = local_1248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1258,
                 "0000000000000000000000000000000000000000000000000000000000000b01","");
      local_1238 = 0;
      local_1230 = &DAT_019abe00;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1208[0] = local_11f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1208,
                 "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))","");
      local_11e8[0] = local_11d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_11e8,
                 "0000000000000000000000000000000000000000000000000000000000000b02","");
      local_11c8 = 0;
      local_11c0 = &DAT_000b71b0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1198[0] = local_1188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1198,
                 "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))","");
      local_1178[0] = local_1168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1178,
                 "0000000000000000000000000000000000000000000000000000000000000b03","");
      local_1158 = 0;
      local_1150 = &DAT_14a61a62;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1128[0] = local_1118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,
                 "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))","");
      local_1108[0] = local_10f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1108,
                 "0000000000000000000000000000000000000000000000000000000000000b04","");
      local_10e8 = 0;
      local_10e0 = &DAT_0119ed3e;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_10b8[0] = local_10a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_10b8,
                 "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))","");
      local_1098[0] = local_1088;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1098,
                 "0000000000000000000000000000000000000000000000000000000000000c01","");
      local_1078 = 0;
      local_1070 = &DAT_023e8eb8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_1048[0] = local_1038;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1048,
                 "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))","");
      local_1028[0] = local_1018;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1028,
                 "0000000000000000000000000000000000000000000000000000000000000c02","");
      local_1008 = 0;
      local_1000._0_8_ = &DAT_079252f0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_fd8 = local_fc8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fd8,
                 "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))","");
      __l._M_len = 0xc;
      __l._M_array = (iterator)local_14f8;
      std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
                (&TestBody::kFundCoinSelectElementsTestVector3,__l,(allocator_type *)local_dd8);
      lVar10 = 0x4d0;
      do {
        TestFundElementsUtxoVector::~TestFundElementsUtxoVector
                  ((TestFundElementsUtxoVector *)(local_14f8 + lVar10));
        lVar10 = lVar10 + -0x70;
      } while (lVar10 != -0x70);
      __cxa_atexit(std::
                   vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                   ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar5 != 0) {
      TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::kExpTxData_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_fb8,kLiquidV1)
  ;
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (local_448,(string *)local_14f8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_1688,
             ((long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar3 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = 0;
    pTVar7 = TestBody::kFundCoinSelectElementsTestVector3.
             super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_dd8);
      if ((pTVar7->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_14f8,(string *)pTVar7);
        cfd::core::Txid::operator=((Txid *)local_dd8,(Txid *)local_14f8);
        local_14f8._0_8_ = &PTR__Txid_002e1e60;
        if ((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]));
        }
      }
      cfd::core::Txid::Txid((Txid *)local_14f8,(string *)pTVar7);
      lVar10 = uVar9 * 0x4f0;
      cfd::core::Txid::operator=
                ((Txid *)(local_1688.
                          super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar10 + 0x28),(Txid *)local_14f8);
      local_14f8._0_8_ = &PTR__Txid_002e1e60;
      if ((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]));
      }
      *(uint32_t *)
       (local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start + lVar10 + 0x48) = pTVar7->vout;
      cfd::core::Amount::Amount((Amount *)local_14f8,pTVar7->amount);
      local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10 + 0x260] = local_14f8[8];
      *(undefined8 *)
       (local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start + lVar10 + 600) = local_14f8._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_14f8,(string *)&pTVar7->asset);
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)
                 (local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar10 + 0x278),
                 (ConfidentialAssetId *)local_14f8);
      local_14f8._0_8_ = &PTR__ConfidentialAssetId_002e2170;
      if ((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_14f8._9_7_,local_14f8[8]));
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 (local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar10 + 0x238));
      *(undefined4 *)
       (local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start + lVar10 + 0x268) = 6;
      local_dd8._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_dd8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_dd8._8_8_);
      }
      pTVar7 = pTVar7 + 1;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (pTVar7 != pTVar3);
  }
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_e58,(string *)local_14f8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_f90,&exp_dummy_asset_a);
  local_f68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f68._M_impl.super__Rb_tree_header._M_header;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f68._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)local_dd8,0x6e6f7c0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (Amount *)local_dd8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)local_dd8,0x14b18c08);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (Amount *)local_dd8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)local_dd8,0x23e8e54);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (Amount *)local_dd8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h","");
  cfd::AddressFactory::GetAddress(local_5c0);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e","");
  cfd::AddressFactory::GetAddress(local_8e8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn","");
  cfd::AddressFactory::GetAddress(local_a60);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_14f8._0_8_ = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m","");
  cfd::AddressFactory::GetAddress(local_bd8);
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_e88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e88._M_impl.super__Rb_tree_header._M_header;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e88._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  pp_Var1 = (_func_int **)(local_dd8 + 0x10);
  if ((_func_int **)local_dd8._0_8_ != pp_Var1) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  if ((_func_int **)local_dd8._0_8_ != pp_Var1) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  if ((_func_int **)local_dd8._0_8_ != pp_Var1) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != local_14e8) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_14f8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_dd8,(Address *)local_5c0,local_770);
  if (local_770[0].data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_770[0].data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_14a0 != (void *)0x0) {
    operator_delete(local_14a0);
  }
  if ((pointer)local_14d0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_14d0._24_8_);
  }
  if ((_func_int **)local_14d0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_14f8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_770,(Address *)local_8e8,local_1e0);
  if (local_1e0[0].data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0[0].data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_14a0 != (void *)0x0) {
    operator_delete(local_14a0);
  }
  if ((pointer)local_14d0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_14d0._24_8_);
  }
  if ((_func_int **)local_14d0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_14f8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1e0,(Address *)local_a60,local_390);
  if (local_390[0].data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_390[0].data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_14a0 != (void *)0x0) {
    operator_delete(local_14a0);
  }
  if ((pointer)local_14d0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_14d0._24_8_);
  }
  if ((_func_int **)local_14d0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14f8._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_14f8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_390,(Address *)local_bd8,(Pubkey *)local_1670);
  if ((_func_int **)local_1670._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1670._0_8_);
  }
  if (local_14a0 != (void *)0x0) {
    operator_delete(local_14a0);
  }
  if ((pointer)local_14d0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_14d0._24_8_);
  }
  if ((_func_int **)local_14d0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  if ((_func_int **)local_14f8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14f8._0_8_);
  }
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578._16_8_ = (pointer)0x0;
  local_1578._0_8_ = (pointer)0x0;
  local_1578._8_8_ = (pointer)0x0;
  cfd::UtxoData::UtxoData((UtxoData *)local_14f8);
  local_1008 = local_1008 & 0xff000000;
  local_1004 = 0;
  cfd::core::Script::Script((Script *)local_1000);
  local_fc8[0] = 0;
  ppuVar2 = (pointer *)
            ((long)&local_f38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_f38._vptr_ConfidentialAssetId = (_func_int **)ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f38,"9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1670,(string *)&local_f38);
  cfd::core::Txid::operator=((Txid *)local_14d0,(Txid *)local_1670);
  local_1670._0_8_ = &PTR__Txid_002e1e60;
  if ((void *)CONCAT71(local_1670._9_7_,local_1670[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1670._9_7_,local_1670[8]));
  }
  if (local_f38._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_f38._vptr_ConfidentialAssetId);
  }
  cfd::core::Amount::Amount((Amount *)local_1670,0x6b22c20);
  local_1298 = local_1670[8];
  local_12a0 = (_func_int **)local_1670._0_8_;
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_1280,&exp_dummy_asset_a);
  std::__cxx11::string::_M_replace((ulong)local_12c0,0,local_12b8[0],0x28d3c6);
  local_1290 = 6;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             *)local_1578,(value_type *)local_14f8);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            (&local_1558,(value_type *)local_14f8);
  cfd::core::Amount::Amount(local_e98);
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)&local_f38);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(0.15);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(0.15);
  cfd::CoinSelectionOption::SetFeeAsset(&local_f38);
  cfd::CoinSelectionOption::SetBlindInfo((NetType)&local_f38,0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((string *)local_c28,&local_16a9,(map *)local_1670,(vector *)&local_1688,
             (map *)&local_f68,(ConfidentialAssetId *)local_1578,
             SUB81((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_e88,0),0.15,(Amount *)&local_f90,
             (UtxoFilter *)CONCAT44(in_stack_ffffffffffffe8cc,1),(CoinSelectionOption *)local_e98,
             local_1534,(NetType)&local_f38,(vector *)&local_16a8,
             (Amount *)CONCAT44(in_stack_ffffffffffffe8f4,3));
  pp_Var1 = (_func_int **)(local_1670 + 0x10);
  if ((_func_int **)local_1670._0_8_ != pp_Var1) {
    operator_delete((void *)local_1670._0_8_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_16d8,"kExpTxData","ctx.GetHex()",&TestBody()::kExpTxData_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1670);
  if ((_func_int **)local_1670._0_8_ != pp_Var1) {
    operator_delete((void *)local_1670._0_8_);
  }
  if (local_16d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1670);
    if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_16d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if ((_func_int **)local_1670._0_8_ != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((_func_int **)local_1670._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1670._0_8_ + 8))();
      }
      local_1670._0_8_ = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_16d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,0x26a);
  local_16d8._0_8_ = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_1670,"618","estimate_fee.GetSatoshiValue()",(int *)&local_16f8,
             (long *)local_16d8);
  if (local_1670[0] == (Amount)0x0) {
    testing::Message::Message((Message *)local_16d8);
    if ((undefined8 *)CONCAT71(local_1670._9_7_,local_1670[8]) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT71(local_1670._9_7_,local_1670[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_16d8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_16d8._0_8_ + 8))();
      }
      local_16d8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1670 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_16d8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_16f8._vptr_Txid =
       (_func_int **)
       ((long)local_16a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_16a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1670,"size_t{3}","append_txout_addresses.size()",
             (unsigned_long *)local_16d8,(unsigned_long *)&local_16f8);
  if (local_1670[0] == (Amount)0x0) {
    testing::Message::Message((Message *)local_16d8);
    if ((undefined8 *)CONCAT71(local_1670._9_7_,local_1670[8]) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT71(local_1670._9_7_,local_1670[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_16d8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_16d8._0_8_ + 8))();
      }
      local_16d8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1670 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((long)local_16a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_16a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",(char *)local_1670._0_8_,
               local_16a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
    if ((_func_int **)local_1670._0_8_ != pp_Var1) {
      operator_delete((void *)local_1670._0_8_);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if ((_func_int **)local_1670._0_8_ != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((_func_int **)local_1670._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_1670._0_8_ + 8))();
        }
        local_1670._0_8_ = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",(char *)local_1670._0_8_,
               ((local_16a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if ((_func_int **)local_1670._0_8_ != pp_Var1) {
      operator_delete((void *)local_1670._0_8_);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if ((_func_int **)local_1670._0_8_ != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((_func_int **)local_1670._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_1670._0_8_ + 8))();
        }
        local_1670._0_8_ = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",(char *)local_1670._0_8_,
               local_16a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if ((_func_int **)local_1670._0_8_ != pp_Var1) {
      operator_delete((void *)local_1670._0_8_);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if ((_func_int **)local_1670._0_8_ != (_func_int **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((_func_int **)local_1670._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_1670._0_8_ + 8))();
        }
        local_1670._0_8_ = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1670,(string *)local_16d8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_16d8 + 0x10)
     ) {
    operator_delete((void *)local_16d8._0_8_);
  }
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,(value_type *)local_dd8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,(value_type *)local_770);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,(value_type *)local_1e0);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,(value_type *)local_390);
  cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_1670);
  cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_1670);
  cfd::ConfidentialTransactionContext::Blind
            ((vector *)local_1670,(long)&local_1598,1,0,(vector *)0x24);
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_1540 = local_1508;
  if (local_1510 != local_1508) {
    lVar10 = local_1510;
    do {
      cfd::core::Txid::Txid(&local_16f8,(Txid *)(lVar10 + 8));
      cfd::core::OutPoint::OutPoint((OutPoint *)local_16d8,&local_16f8,*(uint *)(lVar10 + 0x28));
      local_15b8[0].data_ = (AssertHelperData *)local_15a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_15b8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_eb0,(string *)local_15b8);
      local_1530[0] = local_1520;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1530,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_ed0,(NetType)(string *)local_1530,true);
      cfd::core::SigHashType::SigHashType(local_de4);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_1670,local_16d8,&local_eb0,local_ed0,local_de4,1);
      if (local_ed0[0] != (void *)0x0) {
        operator_delete(local_ed0[0]);
      }
      if (local_1530[0] != local_1520) {
        operator_delete(local_1530[0]);
      }
      if (local_eb0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_eb0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_15b8[0].data_ != (AssertHelperData *)local_15a8) {
        operator_delete(local_15b8[0].data_);
      }
      local_16d8._0_8_ = &PTR__Txid_002e1e60;
      if ((pointer)local_16d8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_16d8._8_8_);
      }
      local_16f8._vptr_Txid = (_func_int **)&PTR__Txid_002e1e60;
      if (local_16f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_16f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar10 = lVar10 + 0x160;
    } while (lVar10 != local_1540);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)&local_1510);
  iVar5 = cfd::core::ConfidentialTransaction::GetVsize();
  if (iVar5 != 0x1018) {
    iVar5 = cfd::core::ConfidentialTransaction::GetVsize();
    if (iVar5 != 0x1019) {
      iVar5 = cfd::core::ConfidentialTransaction::GetVsize();
      if (iVar5 != 0x101a) {
        local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,100);
        uVar6 = cfd::core::ConfidentialTransaction::GetVsize();
        local_15b8[0].data_._0_4_ = uVar6;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)local_16d8,"100","context.GetVsize()",(int *)&local_16f8,
                   (uint *)local_15b8);
        if (local_16d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_16f8);
          if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)local_16d8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (local_15b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x633,pcVar8);
          testing::internal::AssertHelper::operator=(local_15b8,(Message *)&local_16f8);
          testing::internal::AssertHelper::~AssertHelper(local_15b8);
          if (local_16f8._vptr_Txid != (_func_int **)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_16f8._vptr_Txid != (_func_int **)0x0)) {
              (**(code **)(*local_16f8._vptr_Txid + 8))();
            }
            local_16f8._vptr_Txid = (_func_int **)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_16d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1598);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1670);
  local_c28[0] = &PTR__ConfidentialTransactionController_002e1de8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(local_c18);
  local_f00 = &PTR__ConfidentialAssetId_002e2170;
  if (local_ef8 != (void *)0x0) {
    operator_delete(local_ef8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16a8);
  cfd::core::Script::~Script((Script *)local_1000);
  cfd::UtxoData::~UtxoData((UtxoData *)local_14f8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)local_1578);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1558);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_390);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_770);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_dd8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a90);
  cfd::core::Script::~Script(&local_ad0);
  local_b60[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_ae8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_b60);
  if (local_b78 != (void *)0x0) {
    operator_delete(local_b78);
  }
  if (local_b90 != (void *)0x0) {
    operator_delete(local_b90);
  }
  if (local_ba8 != (void *)0x0) {
    operator_delete(local_ba8);
  }
  if (local_bc8 != local_bb8) {
    operator_delete(local_bc8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_918);
  cfd::core::Script::~Script(&local_958);
  local_9e8[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_970);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_9e8);
  if (local_a00 != (void *)0x0) {
    operator_delete(local_a00);
  }
  if (local_a18 != (void *)0x0) {
    operator_delete(local_a18);
  }
  if (local_a30 != (void *)0x0) {
    operator_delete(local_a30);
  }
  if (local_a50 != local_a40) {
    operator_delete(local_a50);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_7a0);
  cfd::core::Script::~Script(&local_7e0);
  local_870[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_7f8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_870);
  if (local_888 != (void *)0x0) {
    operator_delete(local_888);
  }
  if (local_8a0 != (void *)0x0) {
    operator_delete(local_8a0);
  }
  if (local_8b8 != (void *)0x0) {
    operator_delete(local_8b8);
  }
  if (local_8d8 != local_8c8) {
    operator_delete(local_8d8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_478);
  cfd::core::Script::~Script(&local_4b8);
  local_548[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_4d0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_548);
  if (local_560 != (void *)0x0) {
    operator_delete(local_560);
  }
  if (local_578 != (void *)0x0) {
    operator_delete(local_578);
  }
  if (local_590 != (void *)0x0) {
    operator_delete(local_590);
  }
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_f68);
  local_f90._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
  if (local_f90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1688);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(local_448);
  local_fb8[0] = &PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_fa8);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}